

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_array.c
# Opt level: O1

void tabwrite_float(t_tabwrite *x,t_float f)

{
  int iVar1;
  int iVar2;
  _garray *x_00;
  int iVar3;
  int vecsize;
  t_word *vec;
  int local_1c;
  t_word *local_18;
  
  x_00 = (_garray *)pd_findbyclass(x->x_arrayname,garray_class);
  if (x_00 != (_garray *)0x0) {
    iVar1 = garray_getfloatwords(x_00,&local_1c,&local_18);
    if (iVar1 == 0) {
      pd_error(x,"%s: bad template for tabwrite",x->x_arrayname->s_name);
    }
    else {
      iVar2 = (int)x->x_ft1;
      iVar1 = local_1c + -1;
      if (iVar2 < local_1c) {
        iVar1 = iVar2;
      }
      iVar3 = 0;
      if (-1 < iVar2) {
        iVar3 = iVar1;
      }
      local_18[iVar3].w_float = f;
      garray_redraw(x_00);
    }
    return;
  }
  pd_error(x,"%s: no such array",x->x_arrayname->s_name);
  return;
}

Assistant:

static void tabwrite_float(t_tabwrite *x, t_float f)
{
    int vecsize;
    t_garray *a;
    t_word *vec;

    if (!(a = (t_garray *)pd_findbyclass(x->x_arrayname, garray_class)))
        pd_error(x, "%s: no such array", x->x_arrayname->s_name);
    else if (!garray_getfloatwords(a, &vecsize, &vec))
        pd_error(x, "%s: bad template for tabwrite", x->x_arrayname->s_name);
    else
    {
        int n = x->x_ft1;
        if (n < 0)
            n = 0;
        else if (n >= vecsize)
            n = vecsize-1;
        vec[n].w_float = f;
        garray_redraw(a);
    }
}